

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * container_add(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  int iVar1;
  array_container_t *arr;
  uint8_t uVar2;
  uint8_t local_21;
  
  local_21 = typecode;
  arr = (array_container_t *)get_writable_copy_if_shared(c,&local_21);
  if (local_21 == '\x03') {
    run_container_add((run_container_t *)arr,val);
    uVar2 = '\x03';
  }
  else {
    if (local_21 == '\x02') {
      iVar1 = array_container_try_add(arr,val,0x1000);
      uVar2 = '\x02';
      if (iVar1 != -1) goto LAB_0010e733;
      arr = (array_container_t *)bitset_container_from_array(arr);
      bitset_container_add((bitset_container_t *)arr,val);
    }
    else {
      bitset_container_set((bitset_container_t *)arr,val);
    }
    uVar2 = '\x01';
  }
LAB_0010e733:
  *new_typecode = uVar2;
  return arr;
}

Assistant:

static inline container_t *container_add(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_set(CAST_bitset(c), val);
            *new_typecode = BITSET_CONTAINER_TYPE;
            return c;
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *ac = CAST_array(c);
            if (array_container_try_add(ac, val, DEFAULT_MAX_SIZE) != -1) {
                *new_typecode = ARRAY_CONTAINER_TYPE;
                return ac;
            } else {
                bitset_container_t *bitset = bitset_container_from_array(ac);
                bitset_container_add(bitset, val);
                *new_typecode = BITSET_CONTAINER_TYPE;
                return bitset;
            }
        } break;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_add(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}